

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

bool __thiscall
chaiscript::dispatch::Bound_Function::call_match
          (Bound_Function *this,Function_Params *vals,Type_Conversions_State *t_conversions)

{
  int iVar1;
  element_type *peVar2;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_48;
  Function_Params local_30;
  Type_Conversions_State *local_20;
  Type_Conversions_State *t_conversions_local;
  Function_Params *vals_local;
  Bound_Function *this_local;
  
  local_20 = t_conversions;
  t_conversions_local = (Type_Conversions_State *)vals;
  vals_local = (Function_Params *)this;
  peVar2 = std::
           __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_f);
  build_param_list(&local_48,this,(Function_Params *)t_conversions_local);
  Function_Params::Function_Params(&local_30,&local_48);
  iVar1 = (*peVar2->_vptr_Proxy_Function_Base[3])(peVar2,&local_30,local_20);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&local_48)
  ;
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool call_match(const Function_Params &vals, const Type_Conversions_State &t_conversions) const override {
        return m_f->call_match(Function_Params(build_param_list(vals)), t_conversions);
      }